

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O2

void gen_op_movo(DisasContext *s,int d_offset,int s_offset)

{
  TCGContext *tcg_ctx;
  
  tcg_ctx = s->uc->tcg_ctx;
  tcg_gen_ld_i64_x86_64(tcg_ctx,s->tmp1_i64,tcg_ctx->cpu_env,(long)s_offset);
  tcg_gen_st_i64_x86_64(tcg_ctx,s->tmp1_i64,tcg_ctx->cpu_env,(long)d_offset);
  tcg_gen_ld_i64_x86_64(tcg_ctx,s->tmp1_i64,tcg_ctx->cpu_env,(long)s_offset + 8);
  tcg_gen_st_i64_x86_64(tcg_ctx,s->tmp1_i64,tcg_ctx->cpu_env,(long)d_offset + 8);
  return;
}

Assistant:

static inline void gen_op_movo(DisasContext *s, int d_offset, int s_offset)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;

    tcg_gen_ld_i64(tcg_ctx, s->tmp1_i64, tcg_ctx->cpu_env, s_offset + offsetof(ZMMReg, ZMM_Q(0)));
    tcg_gen_st_i64(tcg_ctx, s->tmp1_i64, tcg_ctx->cpu_env, d_offset + offsetof(ZMMReg, ZMM_Q(0)));
    tcg_gen_ld_i64(tcg_ctx, s->tmp1_i64, tcg_ctx->cpu_env, s_offset + offsetof(ZMMReg, ZMM_Q(1)));
    tcg_gen_st_i64(tcg_ctx, s->tmp1_i64, tcg_ctx->cpu_env, d_offset + offsetof(ZMMReg, ZMM_Q(1)));
}